

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int termCanDriveIndex(WhereTerm *pTerm,SrcItem *pSrc,Bitmask notReady)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  if ((pTerm->leftCursor == pSrc->iCursor) && ((pTerm->eOperator & 0x82) != 0)) {
    bVar1 = (pSrc->fg).jointype;
    if ((bVar1 & 0x58) != 0) {
      uVar2 = pTerm->pExpr->flags;
      if ((uVar2 & 3) == 0) {
        return 0;
      }
      if ((pTerm->pExpr->w).iJoin != pSrc->iCursor) {
        return 0;
      }
      if (((bVar1 & 0x18) != 0 & (byte)((uVar2 & 2) >> 1)) != 0) {
        return 0;
      }
    }
    if (((pTerm->prereqRight & notReady) == 0) &&
       (lVar4 = (long)(pTerm->u).x.leftColumn, -1 < lVar4)) {
      iVar3 = sqlite3IndexAffinityOk(pTerm->pExpr,pSrc->pTab->aCol[lVar4].affinity);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

static int termCanDriveIndex(
  const WhereTerm *pTerm,        /* WHERE clause term to check */
  const SrcItem *pSrc,           /* Table we are trying to access */
  const Bitmask notReady         /* Tables in outer loops of the join */
){
  char aff;
  if( pTerm->leftCursor!=pSrc->iCursor ) return 0;
  if( (pTerm->eOperator & (WO_EQ|WO_IS))==0 ) return 0;
  assert( (pSrc->fg.jointype & JT_RIGHT)==0 );
  if( (pSrc->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))!=0
   && !constraintCompatibleWithOuterJoin(pTerm,pSrc)
  ){
    return 0;  /* See https://sqlite.org/forum/forumpost/51e6959f61 */
  }
  if( (pTerm->prereqRight & notReady)!=0 ) return 0;
  assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
  if( pTerm->u.x.leftColumn<0 ) return 0;
  aff = pSrc->pTab->aCol[pTerm->u.x.leftColumn].affinity;
  if( !sqlite3IndexAffinityOk(pTerm->pExpr, aff) ) return 0;
  testcase( pTerm->pExpr->op==TK_IS );
  return 1;
}